

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteTopLevelProject
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  cmake *pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator<char> local_49;
  string local_48;
  
  WriteFileHeader(this,fout);
  WriteMacros(this,fout,root);
  WriteHighLevelDirectives(this,root,fout);
  GhsMultiGpj::WriteGpjTag(PROJECT,fout);
  poVar3 = std::operator<<(fout,"# Top Level Project File");
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = (this->super_cmGlobalGenerator).CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GHS_BSP_NAME",&local_49);
  pcVar4 = cmake::GetCacheDefinition(pcVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = cmSystemTools::IsOff(pcVar4);
  if (!bVar2) {
    poVar3 = std::operator<<(fout,"    -bsp ");
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  bVar2 = cmSystemTools::IsOff((this->OsDir)._M_dataplus._M_p);
  if (!bVar2) {
    pcVar1 = (this->super_cmGlobalGenerator).CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GHS_OS_DIR_OPTION",&local_49);
    pcVar4 = cmake::GetCacheDefinition(pcVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    __first._M_current = (this->OsDir)._M_dataplus._M_p;
    local_48._M_dataplus._M_p._0_1_ = 0x5c;
    local_49 = (allocator<char>)0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + (this->OsDir)._M_string_length),(char *)&local_48,
               (char *)&local_49);
    std::operator<<(fout,"    ");
    bVar2 = cmSystemTools::IsOff(pcVar4);
    if (bVar2) {
      pcVar4 = "";
    }
    std::operator<<(fout,pcVar4);
    poVar3 = std::operator<<(fout,"\"");
    poVar3 = std::operator<<(poVar3,(string *)&this->OsDir);
    poVar3 = std::operator<<(poVar3,"\"");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTopLevelProject(std::ostream& fout,
                                                     cmLocalGenerator* root)
{
  this->WriteFileHeader(fout);
  this->WriteMacros(fout, root);
  this->WriteHighLevelDirectives(root, fout);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fout);

  fout << "# Top Level Project File" << std::endl;

  // Specify BSP option if supplied by user
  const char* bspName =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_BSP_NAME");
  if (!cmSystemTools::IsOff(bspName)) {
    fout << "    -bsp " << bspName << std::endl;
  }

  // Specify OS DIR if supplied by user
  // -- not all platforms require this entry in the project file
  if (!cmSystemTools::IsOff(this->OsDir.c_str())) {
    const char* osDirOption =
      this->GetCMakeInstance()->GetCacheDefinition("GHS_OS_DIR_OPTION");
    std::replace(this->OsDir.begin(), this->OsDir.end(), '\\', '/');
    fout << "    ";
    if (cmSystemTools::IsOff(osDirOption)) {
      fout << "";
    } else {
      fout << osDirOption;
    }
    fout << "\"" << this->OsDir << "\"" << std::endl;
  }
}